

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O3

SUNErrCode SUNContext_ClearErrHandlers(SUNContext sunctx)

{
  SUNErrCode SVar1;
  SUNContext sunctx_local_scope_;
  SUNErrHandler_conflict local_20;
  
  if (sunctx == (SUNContext)0x0) {
    SVar1 = -0x26f5;
  }
  else {
    local_20 = sunctx->err_handler;
    SVar1 = 0;
    if (local_20 != (SUNErrHandler_conflict)0x0) {
      do {
        sunctx->err_handler = local_20->previous;
        SUNErrHandler_Destroy(&local_20);
        local_20 = sunctx->err_handler;
        SVar1 = 0;
      } while (local_20 != (SUNErrHandler_conflict)0x0);
    }
  }
  return SVar1;
}

Assistant:

SUNErrCode SUNContext_ClearErrHandlers(SUNContext sunctx)
{
  if (!sunctx) { return SUN_ERR_SUNCTX_CORRUPT; }

  SUNFunctionBegin(sunctx);
  while (sunctx->err_handler != NULL)
  {
    SUNCheckCall(SUNContext_PopErrHandler(sunctx));
  }
  return SUN_SUCCESS;
}